

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::TestFactoryImpl<YeeGridTest2d_GetStep_Test>::CreateTest
          (TestFactoryImpl<YeeGridTest2d_GetStep_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x40);
  Test::Test(this_00);
  this_00[3]._vptr_Test = (_func_int **)0x0;
  this_00[3].gtest_flag_saver_ = (GTestFlagSaver *)0x0;
  this_00[2]._vptr_Test = (_func_int **)0x0;
  this_00[2].gtest_flag_saver_ = (GTestFlagSaver *)0x0;
  this_00[1]._vptr_Test = (_func_int **)0x0;
  this_00[1].gtest_flag_saver_ = (GTestFlagSaver *)0x0;
  this_00->_vptr_Test = (_func_int **)&PTR__YeeGridTest2d_001f4400;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }